

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCProfile.cpp
# Opt level: O2

bool Assimp::IFC::ProcessProfile(IfcProfileDef *prof,TempMesh *meshout,ConversionData *conv)

{
  uint *puVar1;
  IfcArbitraryClosedProfileDef *def;
  IfcArbitraryOpenProfileDef *def_00;
  IfcParameterizedProfileDef *def_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  string local_1b0;
  format local_190;
  
  def = STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcArbitraryClosedProfileDef>
                  ((Object *)
                   ((long)&(prof->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>).
                           _vptr_ObjectHelper +
                   (long)(prof->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>).
                         _vptr_ObjectHelper[-3]));
  if (def == (IfcArbitraryClosedProfileDef *)0x0) {
    def_00 = STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcArbitraryOpenProfileDef>
                       ((Object *)
                        ((long)&(prof->
                                super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>).
                                _vptr_ObjectHelper +
                        (long)(prof->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>
                              )._vptr_ObjectHelper[-3]));
    if (def_00 == (IfcArbitraryOpenProfileDef *)0x0) {
      def_01 = STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcParameterizedProfileDef>
                         ((Object *)
                          ((long)&(prof->
                                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>).
                                  _vptr_ObjectHelper +
                          (long)(prof->
                                super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>).
                                _vptr_ObjectHelper[-3]));
      if (def_01 == (IfcParameterizedProfileDef *)0x0) {
        STEP::Object::GetClassName_abi_cxx11_
                  (&local_1b0,
                   (Object *)
                   ((long)&(prof->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>).
                           _vptr_ObjectHelper +
                   (long)(prof->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>).
                         _vptr_ObjectHelper[-3]));
        std::operator+(&local_1d0,"skipping unknown IfcProfileDef entity, type is ",&local_1b0);
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
        basic_formatter<std::__cxx11::string>
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_190,
                   &local_1d0);
        LogFunctions<Assimp::IFCImporter>::LogWarn(&local_190);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_1b0);
        return false;
      }
      ProcessParametrizedProfile(def_01,meshout,conv);
    }
    else {
      ProcessOpenProfile(def_00,meshout,conv);
    }
  }
  else {
    ProcessClosedProfile(def,meshout,conv);
  }
  TempMesh::RemoveAdjacentDuplicates(meshout);
  puVar1 = (meshout->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((meshout->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish == puVar1) {
    return false;
  }
  return 1 < *puVar1;
}

Assistant:

bool ProcessProfile(const Schema_2x3::IfcProfileDef& prof, TempMesh& meshout, ConversionData& conv)
{
    if(const Schema_2x3::IfcArbitraryClosedProfileDef* const cprofile = prof.ToPtr<Schema_2x3::IfcArbitraryClosedProfileDef>()) {
        ProcessClosedProfile(*cprofile,meshout,conv);
    }
    else if(const Schema_2x3::IfcArbitraryOpenProfileDef* const copen = prof.ToPtr<Schema_2x3::IfcArbitraryOpenProfileDef>()) {
        ProcessOpenProfile(*copen,meshout,conv);
    }
    else if(const Schema_2x3::IfcParameterizedProfileDef* const cparam = prof.ToPtr<Schema_2x3::IfcParameterizedProfileDef>()) {
        ProcessParametrizedProfile(*cparam,meshout,conv);
    }
    else {
        IFCImporter::LogWarn("skipping unknown IfcProfileDef entity, type is " + prof.GetClassName());
        return false;
    }
    meshout.RemoveAdjacentDuplicates();
    if (!meshout.mVertcnt.size() || meshout.mVertcnt.front() <= 1) {
        return false;
    }
    return true;
}